

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O1

void __thiscall eos::morphablemodel::PcaModel::PcaModel(PcaModel *this,PcaModel *param_1)

{
  Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,_1,_0> *)this,(DenseStorage<float,__1,__1,_1,_0> *)param_1)
  ;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,__1,_0> *)&this->orthonormal_pca_basis,
             (DenseStorage<float,__1,__1,__1,_0> *)&param_1->orthonormal_pca_basis);
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,__1,_0> *)&this->rescaled_pca_basis,
             (DenseStorage<float,__1,__1,__1,_0> *)&param_1->rescaled_pca_basis);
  Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<float,__1,__1,_1,_0> *)&this->eigenvalues,
             (DenseStorage<float,__1,__1,_1,_0> *)&param_1->eigenvalues);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&this->triangle_list,&param_1->triangle_list);
  return;
}

Assistant:

PcaModel() = default;